

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O1

PtexFaceData * __thiscall Ptex::v2_2::PtexReader::getData(PtexReader *this,int faceid,Res res)

{
  byte bVar1;
  char cVar2;
  char cVar3;
  pointer pFVar4;
  uint8_t *puVar5;
  Level **ppLVar6;
  pointer ppLVar7;
  Level *level;
  Entry *pEVar8;
  _func_int *p_Var9;
  ulong uVar10;
  char cVar11;
  int iVar12;
  FaceData *pFVar13;
  FaceData *pFVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint uVar16;
  undefined6 in_register_00000012;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  uint uVar21;
  uint uVar22;
  int levelid;
  uint levelid_00;
  FaceData *unaff_R13;
  char cVar23;
  uint uVar24;
  bool bVar25;
  size_t newMemUsed;
  ReductionKey key;
  size_t tableNewMemUsed;
  long local_50;
  uint local_44;
  ReductionKey local_40;
  size_t local_38;
  long *plVar15;
  
  uVar17 = CONCAT62(in_register_00000012,res);
  if (((faceid < 0) || (this->_ok == false)) ||
     (uVar10 = (ulong)(uint)faceid, (this->_header).nfaces <= (uint)faceid)) {
    pFVar13 = errorData(this,true);
    return &pFVar13->super_PtexFaceData;
  }
  pFVar4 = (this->_faceinfo).
           super__Vector_base<Ptex::v2_2::FaceInfo,_std::allocator<Ptex::v2_2::FaceInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar1 = pFVar4[uVar10].flags;
  if (((bVar1 & 1) != 0) ||
     (cVar23 = (char)(uVar17 & 0xffffffff), (ushort)res < 0x100 && cVar23 == '\0')) {
    pFVar13 = (FaceData *)operator_new(0x18);
    iVar12 = this->_pixelsize;
    puVar5 = this->_constdata;
    (pFVar13->super_PtexFaceData)._vptr_PtexFaceData = (_func_int **)&PTR__PtexFaceData_02d15b88;
    *(uint8_t **)&pFVar13->_res = puVar5 + faceid * iVar12;
    *(int *)&pFVar13[1].super_PtexFaceData._vptr_PtexFaceData = iVar12;
    return &pFVar13->super_PtexFaceData;
  }
  uVar24 = (uint)uVar17;
  cVar11 = (char)((uVar17 & 0xffffffff) >> 8);
  pFVar4 = pFVar4 + uVar10;
  cVar2 = (pFVar4->res).ulog2;
  cVar3 = (pFVar4->res).vlog2;
  if (cVar3 == cVar11 && cVar2 == cVar23) {
    ppLVar6 = (this->_levels).
              super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (*ppLVar6 == (Level *)0x0) {
      readLevel(this,0,ppLVar6);
    }
    pFVar13 = getFace(this,0,*ppLVar6,faceid,res);
    return &pFVar13->super_PtexFaceData;
  }
  levelid_00 = (int)cVar2 - (int)cVar23;
  uVar22 = (int)cVar3 - (int)cVar11;
  if (((bVar1 & 2) == 0) && (levelid_00 == uVar22)) {
    ppLVar7 = (this->_levels).
              super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(long)(int)levelid_00 <
        (ulong)((long)(this->_levels).
                      super__Vector_base<Ptex::v2_2::PtexReader::Level_*,_std::allocator<Ptex::v2_2::PtexReader::Level_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar7 >> 3)) {
      ppLVar6 = ppLVar7 + (int)levelid_00;
      if (*ppLVar6 == (Level *)0x0) {
        local_44 = uVar22;
        readLevel(this,levelid_00,ppLVar6);
        uVar22 = local_44;
      }
      level = *ppLVar6;
      uVar16 = (this->_rfaceids).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar10];
      if ((ulong)(long)(int)uVar16 <
          (ulong)((long)(level->faces).
                        super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(level->faces).
                        super__Vector_base<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3)) {
        unaff_R13 = getFace(this,levelid_00,level,uVar16,res);
      }
      else {
        unaff_R13 = (FaceData *)0x0;
      }
      bVar25 = unaff_R13 == (FaceData *)0x0;
    }
    else {
      bVar25 = true;
    }
    if (!bVar25) {
      return &unaff_R13->super_PtexFaceData;
    }
  }
  uVar16 = (((int)cVar23 | uVar24 & 0xffffff00) << 0x10 ^ faceid) * 0x1000193;
  local_40._val = CONCAT44(faceid,uVar16);
  do {
    pEVar8 = (this->_reductions)._entries;
  } while (pEVar8 == (Entry *)0x0);
  do {
    uVar21 = uVar16 & (this->_reductions)._numEntries - 1;
    pFVar13 = pEVar8[uVar21].value;
    if (pEVar8[uVar21].key._val == local_40._val) break;
    uVar16 = uVar16 + 1;
    bVar25 = pFVar13 != (FaceData *)0x0;
    pFVar13 = (FaceData *)0x0;
  } while (bVar25);
  if (pFVar13 != (FaceData *)0x0) {
    return &pFVar13->super_PtexFaceData;
  }
  local_50 = 0;
  if (((ushort)res & 0x8080) == 0) {
    if ((int)(levelid_00 | uVar22) < 0) {
      pcVar20 = "PtexReader::getData - enlargements not supported";
      lVar18 = 0x30;
    }
    else {
      if ((this->_header).meshtype != 0) {
        uVar19 = (ulong)((int)uVar22 < (int)levelid_00);
        if (levelid_00 == uVar22) {
          uVar19 = uVar17 & 0xffffffff;
        }
        p_Var9 = (this->super_PtexTexture)._vptr_PtexTexture[0x14];
        if ((uVar19 & 1) == 0) {
          iVar12 = (*p_Var9)(this,uVar10,(ulong)((uVar24 & 0x7f00) + (uVar24 & 0x7f) + 0x100));
          plVar15 = (long *)CONCAT44(extraout_var_00,iVar12);
          pFVar13 = (FaceData *)
                    (**(code **)(*plVar15 + 0x50))
                              (plVar15,this,uVar17 & 0xffffffff,PtexUtils::reducev,&local_50);
          (**(code **)(*plVar15 + 0x10))(plVar15);
        }
        else {
          iVar12 = (*p_Var9)(this,uVar10,(ulong)(uVar24 & 0x7f00 | uVar24 + 1 & 0xff));
          plVar15 = (long *)CONCAT44(extraout_var,iVar12);
          pFVar13 = (FaceData *)
                    (**(code **)(*plVar15 + 0x50))
                              (plVar15,this,uVar17 & 0xffffffff,PtexUtils::reduceu,&local_50);
          (**(code **)(*plVar15 + 0x10))(plVar15);
        }
        goto LAB_003b7531;
      }
      if (levelid_00 == uVar22) {
        iVar12 = (*(this->super_PtexTexture)._vptr_PtexTexture[0x14])
                           (this,uVar10,(ulong)((uVar24 & 0x7f00) + (uVar24 + 1 & 0xff) + 0x100));
        plVar15 = (long *)CONCAT44(extraout_var_01,iVar12);
        pFVar13 = (FaceData *)
                  (**(code **)(*plVar15 + 0x50))
                            (plVar15,this,uVar17 & 0xffffffff,PtexUtils::reduceTri,&local_50);
        (**(code **)(*plVar15 + 0x10))(plVar15);
        goto LAB_003b7531;
      }
      pcVar20 = "PtexReader::getData - anisotropic reductions not supported for triangle mesh";
      lVar18 = 0x4c;
    }
  }
  else {
    pcVar20 = "PtexReader::getData - reductions below 1 pixel not supported";
    lVar18 = 0x3c;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar20,lVar18);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
  pFVar13 = errorData(this,false);
LAB_003b7531:
  local_38 = 0;
  pFVar14 = PtexHashMap<Ptex::v2_2::PtexReader::ReductionKey,_Ptex::v2_2::PtexReader::FaceData_*>::
            tryInsert(&this->_reductions,&local_40,pFVar13,&local_38);
  if (pFVar14 == pFVar13) {
    if (local_38 + local_50 != 0) {
      LOCK();
      this->_memUsed = this->_memUsed + local_38 + local_50;
      UNLOCK();
    }
  }
  else if (pFVar13 != (FaceData *)0x0) {
    (*(pFVar13->super_PtexFaceData)._vptr_PtexFaceData[1])(pFVar13);
  }
  return &pFVar14->super_PtexFaceData;
}

Assistant:

PtexFaceData* PtexReader::getData(int faceid, Res res)
{
    if (!_ok || faceid < 0 || size_t(faceid) >= _header.nfaces) {
        return errorData(/*deleteOnRelease*/ true);
    }

    FaceInfo& fi = _faceinfo[faceid];
    if (fi.isConstant() || res == 0) {
        return new ConstDataPtr(getConstData() + faceid * _pixelsize, _pixelsize);
    }

    // determine how many reduction levels are needed
    int redu = fi.res.ulog2 - res.ulog2, redv = fi.res.vlog2 - res.vlog2;

    if (redu == 0 && redv == 0) {
        // no reduction - get level zero (full) res face
        Level* level = getLevel(0);
        FaceData* face = getFace(0, level, faceid, res);
        return face;
    }

    if (redu == redv && !fi.hasEdits()) {
        // reduction is symmetric and non-negative
        // and face has no edits => access data from reduction level (if present)
        int levelid = redu;
        if (size_t(levelid) < _levels.size()) {
            Level* level = getLevel(levelid);

            // get reduction face id
            int rfaceid = _rfaceids[faceid];

            // get the face data (if present)
            FaceData* face = 0;
            if (size_t(rfaceid) < level->faces.size()) {
                face = getFace(levelid, level, rfaceid, res);
            }
            if (face) {
                return face;
            }
        }
    }

    // dynamic reduction required - look in dynamic reduction cache
    ReductionKey key(faceid, res);
    FaceData* face = _reductions.get(key);
    if (face) {
        return face;
    }

    // not found,  generate new reduction
    FaceData *newface = 0;
    size_t newMemUsed = 0;

    if (res.ulog2 < 0 || res.vlog2 < 0) {
        std::cerr << "PtexReader::getData - reductions below 1 pixel not supported" << std::endl;
        newface = errorData();
    }
    else if (redu < 0 || redv < 0) {
        std::cerr << "PtexReader::getData - enlargements not supported" << std::endl;
        newface = errorData();
    }
    else if (_header.meshtype == mt_triangle)
    {
        if (redu != redv) {
            std::cerr << "PtexReader::getData - anisotropic reductions not supported for triangle mesh" << std::endl;
            newface = errorData();
        }
        else {
            PtexPtr<PtexFaceData> psrc ( getData(faceid, Res((int8_t)(res.ulog2+1), (int8_t)(res.vlog2+1))) );
            FaceData* src = static_cast<FaceData*>(psrc.get());
            newface = src->reduce(this, res, PtexUtils::reduceTri, newMemUsed);
        }
    }
    else {
        // determine which direction to blend
        bool blendu;
        if (redu == redv) {
            // for symmetric face blends, alternate u and v blending
            blendu = (res.ulog2 & 1);
        }
        else blendu = redu > redv;

        if (blendu) {
            // get next-higher u-res and reduce in u
            PtexPtr<PtexFaceData> psrc ( getData(faceid, Res((int8_t)(res.ulog2+1), (int8_t)res.vlog2)) );
            FaceData* src = static_cast<FaceData*>(psrc.get());
            newface = src->reduce(this, res, PtexUtils::reduceu, newMemUsed);
        }
        else {
            // get next-higher v-res and reduce in v
            PtexPtr<PtexFaceData> psrc ( getData(faceid, Res((int8_t)res.ulog2, (int8_t)(res.vlog2+1))) );
            FaceData* src = static_cast<FaceData*>(psrc.get());
            newface = src->reduce(this, res, PtexUtils::reducev, newMemUsed);
        }
    }

    size_t tableNewMemUsed = 0;
    face = _reductions.tryInsert(key, newface, tableNewMemUsed);
    if (face != newface) {
        delete newface;
    }
    else {
        increaseMemUsed(newMemUsed + tableNewMemUsed);
    }
    return face;
}